

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

TProb<double> * __thiscall libDAI::TProb<double>::operator^=(TProb<double> *this,Real a)

{
  size_t sVar1;
  reference pvVar2;
  TProb<double> *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  size_t i;
  ulong local_18;
  
  if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
    for (local_18 = 0; sVar1 = size((TProb<double> *)0xb5329e), local_18 < sVar1;
        local_18 = local_18 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->_p,local_18);
      dVar3 = pow(*pvVar2,in_XMM0_Qa);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->_p,local_18);
      *pvVar2 = dVar3;
    }
  }
  return in_RDI;
}

Assistant:

TProb<T>& operator^= (Real a) {
                if( a != 1.0 ) {
                    for( size_t i = 0; i < size(); i++ )
                        _p[i] = std::pow( _p[i], a );
                }
                return *this;
            }